

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

BTreeImpl * __thiscall kj::_::BTreeImpl::operator=(BTreeImpl *this,BTreeImpl *other)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (this->tree != (NodeUnion *)EMPTY_NODE) {
    ::free(this->tree);
  }
  this->tree = other->tree;
  uVar1 = other->height;
  uVar2 = other->freelistHead;
  uVar3 = other->freelistSize;
  this->treeCapacity = other->treeCapacity;
  this->height = uVar1;
  this->freelistHead = uVar2;
  this->freelistSize = uVar3;
  uVar1 = other->endLeaf;
  this->beginLeaf = other->beginLeaf;
  this->endLeaf = uVar1;
  other->tree = (NodeUnion *)EMPTY_NODE;
  other->treeCapacity = 1;
  other->height = 0;
  other->freelistHead = 1;
  other->freelistSize = 0;
  other->beginLeaf = 0;
  other->endLeaf = 0;
  return this;
}

Assistant:

BTreeImpl& BTreeImpl::operator=(BTreeImpl&& other) {
  KJ_DASSERT(&other != this);

  if (tree != &EMPTY_NODE) {
    aligned_free(tree);
  }
  tree = other.tree;
  treeCapacity = other.treeCapacity;
  height = other.height;
  freelistHead = other.freelistHead;
  freelistSize = other.freelistSize;
  beginLeaf = other.beginLeaf;
  endLeaf = other.endLeaf;

  other.tree = const_cast<NodeUnion*>(&EMPTY_NODE);
  other.treeCapacity = 1;
  other.height = 0;
  other.freelistHead = 1;
  other.freelistSize = 0;
  other.beginLeaf = 0;
  other.endLeaf = 0;

  return *this;
}